

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O3

bool __thiscall ParsedJson::iterator::print(iterator *this,ostream *os,bool escape_strings)

{
  ostream *poVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  undefined8 in_RAX;
  size_t sVar6;
  long lVar7;
  fmtflags __old;
  char *pcVar8;
  byte *pbVar9;
  double dVar10;
  undefined8 uStack_38;
  
  uVar4 = this->location;
  if (this->tape_length <= uVar4) {
    return false;
  }
  bVar2 = this->current_type;
  uStack_38._0_7_ = (undefined7)in_RAX;
  uStack_38 = in_RAX;
  if (0x6b < bVar2) {
    if (bVar2 < 0x74) {
      if (bVar2 == 0x6c) {
        std::ostream::_M_insert<long>((long)os);
        return true;
      }
      if (bVar2 != 0x6e) {
        return false;
      }
      pcVar8 = "null";
    }
    else {
      if (bVar2 != 0x74) {
        if ((bVar2 != 0x7b) && (bVar2 != 0x7d)) {
          return false;
        }
        goto LAB_00108371;
      }
      pcVar8 = "true";
    }
    lVar7 = 4;
    goto LAB_00108587;
  }
  if (bVar2 < 0x5d) {
    if (bVar2 != 0x22) {
      if (bVar2 != 0x5b) {
        return false;
      }
      goto LAB_00108371;
    }
    uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
    puVar5 = this->pj->string_buf;
    if (escape_strings) {
      pbVar9 = puVar5 + (this->current_val & 0xffffffffffffff);
      pcVar8 = (char *)((long)&uStack_38 + 7);
      do {
        bVar2 = *pbVar9;
        switch(bVar2) {
        case 0:
          goto switchD_00108562_caseD_0;
        case 1:
        case 2:
        case 3:
        case 4:
        case 5:
        case 6:
        case 7:
        case 0xb:
switchD_00108562_caseD_1:
          if (0x1f < bVar2) {
            uStack_38 = CONCAT17(bVar2,(undefined7)uStack_38);
            break;
          }
          lVar7 = *(long *)os;
          uVar3 = *(uint *)(os + *(long *)(lVar7 + -0x18) + 0x18);
          *(uint *)(os + *(long *)(lVar7 + -0x18) + 0x18) = uVar3 & 0xffffffb5 | 8;
          *(undefined8 *)(os + *(long *)(lVar7 + -0x18) + 0x10) = 4;
          poVar1 = os + *(long *)(lVar7 + -0x18);
          if (os[*(long *)(lVar7 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar1);
            poVar1[0xe1] = (ostream)0x1;
          }
          poVar1[0xe0] = (ostream)0x30;
          std::ostream::operator<<((ostream *)os,(uint)*pbVar9);
          *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar3;
          goto LAB_00108549;
        case 8:
          uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,1);
          uStack_38 = CONCAT17(0x62,(undefined7)uStack_38);
          break;
        case 9:
          uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,1);
          uStack_38 = CONCAT17(0x74,(undefined7)uStack_38);
          break;
        case 10:
          uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,1);
          uStack_38 = CONCAT17(0x6e,(undefined7)uStack_38);
          break;
        case 0xc:
          uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,1);
          uStack_38 = CONCAT17(0x66,(undefined7)uStack_38);
          break;
        case 0xd:
          uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,1);
          uStack_38 = CONCAT17(0x72,(undefined7)uStack_38);
          break;
        default:
          if (bVar2 == 0x22) {
            uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,1);
            uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
          }
          else {
            if (bVar2 != 0x5c) goto switchD_00108562_caseD_1;
            uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,1);
            uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,1);
LAB_00108549:
        pbVar9 = pbVar9 + 1;
      } while( true );
    }
    if (puVar5 == (uint8_t *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      uVar4 = this->current_val;
      sVar6 = strlen((char *)(puVar5 + (uVar4 & 0xffffffffffffff)));
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(char *)(puVar5 + (uVar4 & 0xffffffffffffff)),sVar6);
    }
switchD_00108562_caseD_0:
    uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
  }
  else {
    if (bVar2 != 0x5d) {
      if (bVar2 == 100) {
        if (uVar4 + 1 < this->tape_length) {
          dVar10 = (double)this->pj->tape[uVar4 + 1];
        }
        else {
          dVar10 = NAN;
        }
        std::ostream::_M_insert<double>(dVar10);
        return true;
      }
      if (bVar2 != 0x66) {
        return false;
      }
      pcVar8 = "false";
      lVar7 = 5;
      goto LAB_00108587;
    }
LAB_00108371:
    uStack_38 = CONCAT17(bVar2,(undefined7)uStack_38);
  }
  pcVar8 = (char *)((long)&uStack_38 + 7);
  lVar7 = 1;
LAB_00108587:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,lVar7);
  return true;
}

Assistant:

bool ParsedJson::iterator::print(std::ostream &os, bool escape_strings) const {
    if(!isOk()) { return false;
}
    switch (current_type) {
    case '"': // we have a string
    os << '"';
    if(escape_strings) {
        print_with_escapes(get_string(), os);
    } else {
        os << get_string();
    }
    os << '"';
    break;
    case 'l': // we have a long int
    os << get_integer();
    break;
    case 'd':
    os << get_double();
    break;
    case 'n': // we have a null
    os << "null";
    break;
    case 't': // we have a true
    os << "true";
    break;
    case 'f': // we have a false
    os << "false";
    break;
    case '{': // we have an object
    case '}': // we end an object
    case '[': // we start an array
    case ']': // we end an array
    os << static_cast<char>(current_type);
    break;
    default:
    return false;
    }
    return true;
}